

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onepass.cc
# Opt level: O3

bool __thiscall
re2::Prog::SearchOnePass
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match,int nmatch)

{
  int iVar1;
  undefined8 uVar2;
  uint uVar3;
  byte bVar4;
  uint32 uVar5;
  uint uVar6;
  uint32 uVar7;
  void *pvVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  byte *pbVar12;
  OneState *pOVar13;
  uint uVar14;
  byte *p;
  ulong uVar15;
  StringPiece context;
  uint32 statesize;
  char *matchcap [10];
  char *cap [10];
  MatchKind local_260;
  StringPiece local_258;
  undefined8 local_248;
  byte *local_240;
  uint local_238;
  int local_234;
  OneState *local_230;
  size_t local_228;
  StringPiece *local_220;
  uint8 *local_218;
  Prog *local_210;
  byte *local_208;
  byte *local_200;
  byte *local_1f8 [8];
  LogMessage local_1b8;
  
  if (kind == kFullMatch || anchor == kAnchored) {
    uVar3 = nmatch * 2;
    uVar15 = 2;
    if (2 < (int)uVar3) {
      uVar15 = (ulong)uVar3;
    }
    memset(&local_1b8,0,uVar15 * 8);
    memset(&local_208,0,uVar15 * 8);
    local_258.ptr_ = const_context->ptr_;
    local_258.length_ = const_context->length_;
    local_258._12_4_ = *(undefined4 *)&const_context->field_0xc;
    if ((byte *)local_258.ptr_ == (byte *)0x0) {
      local_258.length_ = text->length_;
      local_258.ptr_ = text->ptr_;
    }
    p = (byte *)text->ptr_;
    if ((this->anchor_start_ != true) || ((byte *)local_258.ptr_ == p)) {
      if (this->anchor_end_ == false) {
        iVar1 = text->length_;
        lVar11 = (long)iVar1;
        local_260 = kind;
      }
      else {
        iVar1 = text->length_;
        lVar11 = (long)iVar1;
        if ((byte *)(local_258.ptr_ + local_258.length_) != p + lVar11) goto LAB_0012996a;
        local_260 = kFullMatch;
      }
      local_218 = this->onepass_nodes_;
      pOVar13 = this->onepass_start_;
      local_234 = this->onepass_statesize_;
      local_208 = p;
      local_1b8._0_8_ = p;
      uVar7 = pOVar13->matchcond;
      local_220 = match;
      if (iVar1 < 1) {
        local_248 = 0;
      }
      else {
        pbVar12 = p + lVar11;
        uVar9 = 3;
        if (3 < (int)uVar3) {
          uVar9 = uVar3;
        }
        local_228 = (ulong)(uVar9 - 2) << 3;
        local_248 = 0;
        local_240 = pbVar12;
        local_210 = this;
        do {
          uVar9 = pOVar13[(ulong)local_210->bytemap_[*p] + 1].matchcond;
          if (((uVar9 & 0x3f) == 0) ||
             (uVar5 = EmptyFlags(&local_258,(char *)p), pbVar12 = local_240,
             (uVar9 & 0x3f & ~uVar5) == 0)) {
            lVar11 = (ulong)(uVar9 >> 0x10) * (long)local_234;
            pOVar13 = (OneState *)(local_218 + lVar11);
            uVar14 = *(uint *)(local_218 + lVar11);
          }
          else {
            uVar14 = 0x30;
            pOVar13 = (OneState *)0x0;
          }
          if ((local_260 != kFullMatch) && (uVar7 != 0x30)) {
            uVar6 = uVar14 & 0x3f | uVar9 & 0x40;
            if (uVar6 != 0) {
              local_230 = pOVar13;
              if ((uVar7 & 0x3f) != 0) {
                local_238 = uVar14;
                uVar5 = EmptyFlags(&local_258,(char *)p);
                uVar6 = ~uVar5;
                pbVar12 = local_240;
                pOVar13 = local_230;
                uVar14 = local_238;
                if ((uVar7 & 0x3f & uVar6) != 0) goto LAB_00129b3f;
              }
              pvVar8 = (void *)(ulong)uVar6;
              if ((1 < nmatch) &&
                 (pvVar8 = memcpy(local_1f8,&local_1b8.field_0x10,local_228), pbVar12 = local_240,
                 (uVar7 & 0x7f80) != 0)) {
                uVar10 = 2;
                do {
                  uVar6 = uVar7 >> ((byte)uVar10 & 0x1f);
                  pvVar8 = (void *)(ulong)uVar6;
                  if ((uVar6 & 0x20) != 0) {
                    (&local_208)[uVar10] = p;
                  }
                  uVar10 = uVar10 + 1;
                } while (uVar15 != uVar10);
              }
              local_200 = p;
              local_248 = CONCAT71((int7)((ulong)pvVar8 >> 8),1);
              pOVar13 = local_230;
              if ((local_260 == kFirstMatch) && ((uVar9 & 0x40) != 0)) goto LAB_00129c21;
            }
          }
LAB_00129b3f:
          uVar7 = uVar14;
          if (pOVar13 == (OneState *)0x0) goto LAB_00129c21;
          if ((1 < nmatch) && ((uVar9 & 0x7f80) != 0)) {
            uVar10 = 2;
            do {
              if ((uVar9 >> ((byte)uVar10 & 0x1f) & 0x20) != 0) {
                *(byte **)(&local_1b8.severity_ + uVar10 * 2) = p;
              }
              uVar10 = uVar10 + 1;
            } while (uVar15 != uVar10);
          }
          p = p + 1;
        } while (p < pbVar12);
      }
      uVar9 = pOVar13->matchcond;
      if ((uVar9 != 0x30) &&
         (((uVar9 & 0x3f) == 0 ||
          (uVar7 = EmptyFlags(&local_258,(char *)p), (uVar9 & 0x3f & ~uVar7) == 0)))) {
        if ((1 < nmatch) && ((uVar9 & 0x7f80) != 0)) {
          uVar10 = 2;
          do {
            if ((uVar9 >> ((byte)uVar10 & 0x1f) & 0x20) != 0) {
              *(byte **)(&local_1b8.severity_ + uVar10 * 2) = p;
            }
            uVar10 = uVar10 + 1;
          } while (uVar15 != uVar10);
        }
        if (1 < nmatch) {
          uVar9 = 3;
          if (3 < (int)uVar3) {
            uVar9 = uVar3;
          }
          memcpy(local_1f8,&local_1b8.field_0x10,(ulong)(uVar9 - 2) << 3);
        }
        local_200 = p;
        local_248 = 1;
      }
LAB_00129c21:
      bVar4 = (byte)local_248;
      if ((~bVar4 & 1) == 0 && 0 < nmatch) {
        lVar11 = 0;
        do {
          uVar2 = *(undefined8 *)((long)&local_208 + lVar11);
          iVar1 = *(int *)((long)local_1f8 + lVar11 + -8);
          *(undefined8 *)((long)&local_220->ptr_ + lVar11) = uVar2;
          *(int *)((long)&local_220->length_ + lVar11) = iVar1 - (int)uVar2;
          lVar11 = lVar11 + 0x10;
        } while ((ulong)(uint)nmatch << 4 != lVar11);
      }
      goto LAB_0012996c;
    }
  }
  else {
    LogMessage::LogMessage
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/onepass.cc",
               0xd0,3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.str_,"Cannot use SearchOnePass for unanchored matches.",0x30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
  }
LAB_0012996a:
  bVar4 = 0;
LAB_0012996c:
  return (bool)(bVar4 & 1);
}

Assistant:

bool Prog::SearchOnePass(const StringPiece& text,
                         const StringPiece& const_context,
                         Anchor anchor, MatchKind kind,
                         StringPiece* match, int nmatch) {
  if (anchor != kAnchored && kind != kFullMatch) {
    LOG(DFATAL) << "Cannot use SearchOnePass for unanchored matches.";
    return false;
  }

  // Make sure we have at least cap[1],
  // because we use it to tell if we matched.
  int ncap = 2*nmatch;
  if (ncap < 2)
    ncap = 2;

  const char* cap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    cap[i] = NULL;

  const char* matchcap[kMaxCap];
  for (int i = 0; i < ncap; i++)
    matchcap[i] = NULL;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;
  if (anchor_start() && context.begin() != text.begin())
    return false;
  if (anchor_end() && context.end() != text.end())
    return false;
  if (anchor_end())
    kind = kFullMatch;

  // State and act are marked volatile to
  // keep the compiler from re-ordering the
  // memory accesses walking over the NFA.
  // This is worth about 5%.
  volatile OneState* state = onepass_start_;
  volatile uint8* nodes = onepass_nodes_;
  volatile uint32 statesize = onepass_statesize_;
  uint8* bytemap = bytemap_;
  const char* bp = text.begin();
  const char* ep = text.end();
  const char* p;
  bool matched = false;
  matchcap[0] = bp;
  cap[0] = bp;
  uint32 nextmatchcond = state->matchcond;
  for (p = bp; p < ep; p++) {
    int c = bytemap[*p & 0xFF];
    uint32 matchcond = nextmatchcond;
    uint32 cond = state->action[c];

    // Determine whether we can reach act->next.
    // If so, advance state and nextmatchcond.
    if ((cond & kEmptyAllFlags) == 0 || Satisfy(cond, context, p)) {
      uint32 nextindex = cond >> kIndexShift;
      state = IndexToNode(nodes, statesize, nextindex);
      nextmatchcond = state->matchcond;
    } else {
      state = NULL;
      nextmatchcond = kImpossible;
    }

    // This code section is carefully tuned.
    // The goto sequence is about 10% faster than the
    // obvious rewrite as a large if statement in the
    // ASCIIMatchRE2 and DotMatchRE2 benchmarks.

    // Saving the match capture registers is expensive.
    // Is this intermediate match worth thinking about?

    // Not if we want a full match.
    if (kind == kFullMatch)
      goto skipmatch;

    // Not if it's impossible.
    if (matchcond == kImpossible)
      goto skipmatch;

    // Not if the possible match is beaten by the certain
    // match at the next byte.  When this test is useless
    // (e.g., HTTPPartialMatchRE2) it slows the loop by
    // about 10%, but when it avoids work (e.g., DotMatchRE2),
    // it cuts the loop execution by about 45%.
    if ((cond & kMatchWins) == 0 && (nextmatchcond & kEmptyAllFlags) == 0)
      goto skipmatch;

    // Finally, the match conditions must be satisfied.
    if ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p)) {
      for (int i = 2; i < 2*nmatch; i++)
        matchcap[i] = cap[i];
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, matchcap, ncap);
      matchcap[1] = p;
      matched = true;

      // If we're in longest match mode, we have to keep
      // going and see if we find a longer match.
      // In first match mode, we can stop if the match
      // takes priority over the next state for this input byte.
      // That bit is per-input byte and thus in cond, not matchcond.
      if (kind == kFirstMatch && (cond & kMatchWins))
        goto done;
    }

  skipmatch:
    if (state == NULL)
      goto done;
    if ((cond & kCapMask) && nmatch > 1)
      ApplyCaptures(cond, p, cap, ncap);
  }

  // Look for match at end of input.
  {
    uint32 matchcond = state->matchcond;
    if (matchcond != kImpossible &&
        ((matchcond & kEmptyAllFlags) == 0 || Satisfy(matchcond, context, p))) {
      if (nmatch > 1 && (matchcond & kCapMask))
        ApplyCaptures(matchcond, p, cap, ncap);
      for (int i = 2; i < ncap; i++)
        matchcap[i] = cap[i];
      matchcap[1] = p;
      matched = true;
    }
  }

done:
  if (!matched)
    return false;
  for (int i = 0; i < nmatch; i++)
    match[i].set(matchcap[2*i],
                 static_cast<int>(matchcap[2*i+1] - matchcap[2*i]));
  return true;
}